

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void Am_Connection::Handle_Sockets(fd_set *readfds)

{
  Am_Connection_Data *pAVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  connection_list_class *pcVar5;
  socklen_t i;
  sockaddr_in sa;
  socklen_t local_2c;
  sockaddr local_28;
  
  pcVar5 = connection_list;
  if (num_sockets != 0) {
    for (; pcVar5 != (Connection_List_Ptr)0x0; pcVar5 = pcVar5->next) {
      pAVar1 = pcVar5->connection_ptr->data;
      if (pAVar1->connected == true) {
        uVar3 = *(uint *)&(pAVar1->super_Am_Wrapper).field_0xc;
        uVar4 = uVar3 + 0x3f;
        if (-1 < (int)uVar3) {
          uVar4 = uVar3;
        }
        if (((ulong)readfds->fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
          Handle_Input(pcVar5->connection_ptr);
        }
      }
    }
    iVar2 = m_parent_socket + 0x3f;
    if (-1 < m_parent_socket) {
      iVar2 = m_parent_socket;
    }
    if ((m_parent_socket != 0) &&
       (pcVar5 = connection_list,
       (1L << ((byte)m_parent_socket & 0x3f) & readfds->fds_bits[iVar2 >> 6]) != 0)) {
      while( true ) {
        if (pcVar5 == (Connection_List_Ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"C:hs: remote connection received without receiving",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"connection waiting\n",0x13);
          std::ostream::flush();
          return;
        }
        if (pcVar5->connection_ptr->data->waiting != false) break;
        pcVar5 = pcVar5->next;
      }
      local_2c = 0x10;
      uVar3 = accept(m_parent_socket,&local_28,&local_2c);
      if ((int)uVar3 < 0) {
        perror("accept");
      }
      else {
        pAVar1 = pcVar5->connection_ptr->data;
        *(uint *)&(pAVar1->super_Am_Wrapper).field_0xc = uVar3;
        socket_flags->fds_bits[uVar3 >> 6] =
             socket_flags->fds_bits[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
        pAVar1->connected = true;
        pAVar1->waiting = false;
      }
    }
  }
  return;
}

Assistant:

void
Am_Connection::Handle_Sockets(fd_set *readfds)
{
  if (!num_sockets)
    return;
  else {

    Connection_List_Ptr local_list;
    local_list = connection_list;
    ////
    //// Check Connections for incoming data
    ////
    while (local_list != nullptr) {
      if ((local_list->connection_ptr->Connected()) &&
          (FD_ISSET((local_list->connection_ptr->Get_Socket()), readfds))) {
        local_list->connection_ptr->Handle_Input();
      }
      local_list = local_list->next;
    }
    ////
    //// Check Parent socket for new connections
    ////
    /* This assumes that we don't need each side to specify the other.
 * The first waiting connection will get the first caller.
 * A better way might be to have the Handle sockets check the address of
 * the caller.
 */
    if ((FD_ISSET(m_parent_socket, readfds)) && (m_parent_socket != 0)) {
      local_list = connection_list;
      while ((local_list != nullptr) &&
             (!(local_list->connection_ptr->Waiting()))) {
        local_list = local_list->next;
      }
      if (local_list == nullptr)
        std::cerr << "C:hs: remote connection received without receiving"
                  << "connection waiting\n"
                  << std::flush;
      else {
        socklen_t i;
        int temp_socket;
        struct sockaddr_in sa;
        i = sizeof(sa);
        if ((temp_socket =
                 accept(m_parent_socket, (struct sockaddr *)&sa, &i)) < 0) {
          perror("accept");
        } else {
          local_list->connection_ptr->Set_Socket(temp_socket);
          local_list->connection_ptr->Set_Waiting_Flag(false);
          local_list->connection_ptr->Set_Connect_Flag(true);
        }

      } // Found new connection
    }   // someone trying to connect to parent
  }     // There is at least 1 connection
}